

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

uint __thiscall crnlib::symbol_codec::decode_peek_bits(symbol_codec *this,uint num_bits)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  
  if (num_bits == 0) {
    uVar5 = 0;
  }
  else {
    if (this->m_bit_count < (int)num_bits) {
      pbVar3 = this->m_pDecode_buf_next;
      pbVar6 = this->m_pDecode_buf_end;
      do {
        if (pbVar3 == pbVar6) {
          uVar4 = 0;
          if (this->m_decode_buf_eof == false) {
            (*this->m_pDecode_need_bytes_func)
                      ((long)pbVar6 - (long)this->m_pDecode_buf,this->m_pDecode_private_data,
                       &this->m_pDecode_buf,&this->m_decode_buf_size,&this->m_decode_buf_eof);
            pbVar3 = this->m_pDecode_buf;
            pbVar6 = pbVar3 + this->m_decode_buf_size;
            this->m_pDecode_buf_end = pbVar6;
            this->m_pDecode_buf_next = pbVar3;
            if (0 < (long)this->m_decode_buf_size) goto LAB_00195071;
          }
        }
        else {
LAB_00195071:
          this->m_pDecode_buf_next = pbVar3 + 1;
          uVar4 = (uint)*pbVar3;
          pbVar3 = pbVar3 + 1;
        }
        iVar2 = this->m_bit_count;
        iVar1 = iVar2 + 8;
        this->m_bit_count = iVar1;
        uVar4 = uVar4 << (0x18U - (char)iVar2 & 0x1f) | this->m_bit_buf;
        this->m_bit_buf = uVar4;
      } while (iVar1 < (int)num_bits);
    }
    else {
      uVar4 = this->m_bit_buf;
    }
    uVar5 = uVar4 >> (-(char)num_bits & 0x1fU);
  }
  return uVar5;
}

Assistant:

uint symbol_codec::decode_peek_bits(uint num_bits) {
  CRNLIB_ASSERT(m_mode == cDecoding);
  CRNLIB_ASSERT(num_bits <= 25);

  if (!num_bits)
    return 0;

  while (m_bit_count < (int)num_bits) {
    uint c = 0;
    if (m_pDecode_buf_next == m_pDecode_buf_end) {
      if (!m_decode_buf_eof) {
        m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
        m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
        m_pDecode_buf_next = m_pDecode_buf;
        if (m_pDecode_buf_next < m_pDecode_buf_end)
          c = *m_pDecode_buf_next++;
      }
    } else
      c = *m_pDecode_buf_next++;

    m_bit_count += 8;
    CRNLIB_ASSERT(m_bit_count <= cBitBufSize);

    m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
  }

  return static_cast<uint>(m_bit_buf >> (cBitBufSize - num_bits));
}